

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O0

Remotes * Omega_h::unmap_owners
                    (Remotes *__return_storage_ptr__,Mesh *old_mesh,Int ent_dim,
                    LOs *new_ents2old_ents,LOs *old_ents2new_ents)

{
  char *file;
  Write<int> local_2e0;
  Read<int> local_2d0;
  Write<int> local_2c0;
  Read<int> local_2b0;
  Read<int> local_2a0;
  Read<int> local_290;
  undefined1 local_280 [8];
  Write<int> new_own_ranks;
  undefined1 local_250 [8];
  Read<int> old_own_ranks;
  Read<int> local_230;
  undefined1 local_220 [8];
  Write<int> new_ents2new_owners;
  undefined1 local_200 [8];
  Read<int> old_copies2new_owners;
  Dist old_owners2old_copies;
  Dist old_copies2old_owners;
  allocator local_99;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [39];
  ScopedTimer local_31;
  LOs *pLStack_30;
  ScopedTimer omega_h_scoped_function_timer;
  LOs *old_ents2new_ents_local;
  LOs *new_ents2old_ents_local;
  Int ent_dim_local;
  Mesh *old_mesh_local;
  
  pLStack_30 = old_ents2new_ents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_unmap_mesh.cpp"
             ,&local_99);
  std::operator+(local_78,(char *)local_98);
  std::__cxx11::to_string
            ((__cxx11 *)
             &old_copies2old_owners.comm_[1].
              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0x32);
  std::operator+(local_58,local_78);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_31,"unmap_owners",file);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &old_copies2old_owners.comm_[1].
              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Mesh::ask_dist((Dist *)&old_owners2old_copies.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 old_mesh,ent_dim);
  Dist::invert((Dist *)&old_copies2new_owners.write_.shared_alloc_.direct_ptr,
               (Dist *)&old_owners2old_copies.comm_[1].
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Read<int>::Read((Read<int> *)&new_ents2new_owners.shared_alloc_.direct_ptr,old_ents2new_ents);
  Dist::exch<int>((Dist *)local_200,
                  (Read<int> *)&old_copies2new_owners.write_.shared_alloc_.direct_ptr,
                  (int)&new_ents2new_owners + 8);
  Read<int>::~Read((Read<int> *)&new_ents2new_owners.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_230,new_ents2old_ents);
  Read<int>::Read((Read<int> *)&old_own_ranks.write_.shared_alloc_.direct_ptr,(Read<int> *)local_200
                 );
  unmap<int>((Omega_h *)local_220,&local_230,
             (Read<int> *)&old_own_ranks.write_.shared_alloc_.direct_ptr,1);
  Read<int>::~Read((Read<int> *)&old_own_ranks.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_230);
  Mesh::ask_owners((Remotes *)&new_own_ranks.shared_alloc_.direct_ptr,old_mesh,ent_dim);
  Read<int>::Read((Read<int> *)local_250,(Read<int> *)&new_own_ranks.shared_alloc_.direct_ptr);
  Remotes::~Remotes((Remotes *)&new_own_ranks.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_290,new_ents2old_ents);
  Read<int>::Read(&local_2a0,(Read<int> *)local_250);
  unmap<int>((Omega_h *)local_280,&local_290,&local_2a0,1);
  Read<int>::~Read(&local_2a0);
  Read<int>::~Read(&local_290);
  Write<int>::Write(&local_2c0,(Write<int> *)local_280);
  Read<int>::Read(&local_2b0,&local_2c0);
  Write<int>::Write(&local_2e0,(Write<int> *)local_220);
  Read<int>::Read(&local_2d0,&local_2e0);
  Remotes::Remotes(__return_storage_ptr__,&local_2b0,&local_2d0);
  Read<int>::~Read(&local_2d0);
  Write<int>::~Write(&local_2e0);
  Read<int>::~Read(&local_2b0);
  Write<int>::~Write(&local_2c0);
  Write<int>::~Write((Write<int> *)local_280);
  Read<int>::~Read((Read<int> *)local_250);
  Write<int>::~Write((Write<int> *)local_220);
  Read<int>::~Read((Read<int> *)local_200);
  Dist::~Dist((Dist *)&old_copies2new_owners.write_.shared_alloc_.direct_ptr);
  Dist::~Dist((Dist *)&old_owners2old_copies.comm_[1].
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ScopedTimer::~ScopedTimer(&local_31);
  return __return_storage_ptr__;
}

Assistant:

Remotes unmap_owners(
    Mesh* old_mesh, Int ent_dim, LOs new_ents2old_ents, LOs old_ents2new_ents) {
  OMEGA_H_TIME_FUNCTION;
  auto old_copies2old_owners = old_mesh->ask_dist(ent_dim);
  auto old_owners2old_copies = old_copies2old_owners.invert();
  auto old_copies2new_owners = old_owners2old_copies.exch(old_ents2new_ents, 1);
  auto new_ents2new_owners = unmap(new_ents2old_ents, old_copies2new_owners, 1);
  auto old_own_ranks = old_mesh->ask_owners(ent_dim).ranks;
  auto new_own_ranks = unmap(new_ents2old_ents, old_own_ranks, 1);
  return Remotes(new_own_ranks, new_ents2new_owners);
}